

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.h
# Opt level: O2

int ReleaseGlobals(void)

{
  uint uVar1;
  CRITICAL_SECTION *__mutex;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 1;
  nbwpstmp = 0;
  bDeleteRoute = 1;
  memset(wpstmplat,0,0x2000);
  memset(wpstmplong,0,0x2000);
  memset(wpstmpalt,0,0x2000);
  nbWPs = 0;
  CurWP = 0;
  bWaypointsChanged = 1;
  memset(wpslat,0,0x2000);
  memset(wpslong,0,0x2000);
  memset(wpsalt,0,0x2000);
  pthread_mutex_destroy((pthread_mutex_t *)&strtimeCS);
  pthread_mutex_destroy((pthread_mutex_t *)&RegistersCS);
  pthread_mutex_destroy((pthread_mutex_t *)&idsCS);
  pthread_mutex_destroy((pthread_mutex_t *)&OpenCVVideoRecordCS);
  pthread_mutex_destroy((pthread_mutex_t *)&OpenCVVideoCS);
  pthread_mutex_destroy((pthread_mutex_t *)&OpenCVGUICS);
  pthread_mutex_destroy((pthread_mutex_t *)&MissionFilesCS);
  pthread_mutex_destroy((pthread_mutex_t *)&StateVariablesCS);
  pthread_mutex_destroy((pthread_mutex_t *)&SeanetDataCS);
  pthread_mutex_destroy((pthread_mutex_t *)&SeanetConnectingCS);
  pthread_mutex_destroy((pthread_mutex_t *)&SeanetOverlayImgCS);
  pthread_mutex_destroy((pthread_mutex_t *)&MDMCS);
  pthread_mutex_destroy((pthread_mutex_t *)&FollowMeCS);
  for (uVar1 = 7; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    pthread_mutex_destroy((pthread_mutex_t *)(ExternalProgramTriggerCS + uVar1));
  }
  pthread_mutex_destroy((pthread_mutex_t *)&SonarAltitudeEstimationCS);
  uVar3 = (ulong)(uint)nbopencvgui;
  __mutex = dispimgsCS + uVar3;
  while( true ) {
    __mutex = __mutex + -1;
    if ((int)uVar3 < 1) break;
    pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    uVar3 = (ulong)((int)uVar3 - 1);
  }
  for (uVar1 = 4; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    videorecordheight[uVar1] = videoimgheight;
    videorecordwidth[uVar1] = videoimgwidth;
    memset(endvideorecordfilenames + uVar1,0,0x100);
    endvideorecordfiles[uVar1] = (FILE *)0x0;
    memset(videorecordfilenames + uVar1,0,0x100);
    bVideoRecordRestart[uVar1] = 0;
    VideoRecordRequests[uVar1] = 0;
    pthread_mutex_destroy((pthread_mutex_t *)(VideoRecordRequestsCS + uVar1));
    bRestartVideo[uVar1] = 0;
    bPauseVideo[uVar1] = 0;
    xVideo[uVar1] = 0.0;
    yVideo[uVar1] = 0.0;
    zVideo[uVar1] = 0.0;
    phiVideo[uVar1] = 0.0;
    thetaVideo[uVar1] = 0.0;
    psiVideo[uVar1] = 0.0;
    VerticalBeamVideo[uVar1] = 50.0;
    HorizontalBeamVideo[uVar1] = 70.0;
    pthread_mutex_destroy((pthread_mutex_t *)(imgsCS + uVar1));
  }
  for (uVar1 = 2; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    bRestartPololu[uVar1] = 0;
    bPausePololu[uVar1] = 0;
    SetPositionMaestroPololu[uVar1] = -1;
    ShowGetPositionMaestroPololu[uVar1] = -1;
  }
  for (; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    bRestartRoboteq[uVar2] = 0;
    bPauseRoboteq[uVar2] = 0;
  }
  for (uVar2 = 2; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    bRestartMAVLinkDevice[uVar2] = 0;
    bPauseMAVLinkDevice[uVar2] = 0;
    GNSSqualityMAVLinkDevice[uVar2] = 0;
    land_altitudeMAVLinkDevice[uVar2] = 0.0;
    land_longitudeMAVLinkDevice[uVar2] = 0.0;
    land_latitudeMAVLinkDevice[uVar2] = 0.0;
    land_yawMAVLinkDevice[uVar2] = 0.0;
    bLandMAVLinkDevice[uVar2] = 0;
    takeoff_altitudeMAVLinkDevice[uVar2] = 0.0;
    bTakeoffMAVLinkDevice[uVar2] = 0;
    setattitudetargetthrustMAVLinkDevice[uVar2] = 0.0;
    setattitudetargetyaw_rateMAVLinkDevice[uVar2] = 0.0;
    setattitudetargetpitch_rateMAVLinkDevice[uVar2] = 0.0;
    setattitudetargetroll_rateMAVLinkDevice[uVar2] = 0.0;
    setattitudetargetyawMAVLinkDevice[uVar2] = 0.0;
    setattitudetargetpitchMAVLinkDevice[uVar2] = 0.0;
    setattitudetargetrollMAVLinkDevice[uVar2] = 0.0;
    setattitudetargettypeMAVLinkDevice[uVar2] = -1;
    setattitudetargetperiodMAVLinkDevice[uVar2] = -1;
    iArmMAVLinkDevice[uVar2] = -1;
    custom_modeMAVLinkDevice[uVar2] = -1;
    bDisplayStatusTextMAVLinkDevice[uVar2] = 0;
    bEnableMAVLinkDeviceIN[uVar2] = 0;
  }
  for (uVar2 = 2; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    std::
    vector<std::deque<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::deque<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::pop_back(&RTCMuserslist);
    bRestartublox[uVar2] = 0;
    bPauseublox[uVar2] = 0;
    GNSSqualityublox[uVar2] = 0;
  }
  for (uVar2 = 1; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    bRestartNMEADevice[uVar2] = 0;
    bPauseNMEADevice[uVar2] = 0;
    GNSSqualityNMEADevice[uVar2] = 0;
  }
  for (uVar2 = 1; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    bRestartBlueView[uVar2] = 0;
    bPauseBlueView[uVar2] = 0;
  }
  return 0;
}

Assistant:

inline int ReleaseGlobals(void)
{
	int i = 0;

	bDeleteRoute = TRUE;
	nbwpstmp = 0;
	memset(wpstmplat, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmplong, 0, MAX_NB_WP*sizeof(double));
	memset(wpstmpalt, 0, MAX_NB_WP*sizeof(double));
	bWaypointsChanged = TRUE;
	nbWPs = 0;
	CurWP = 0;
	memset(wpslat, 0, MAX_NB_WP*sizeof(double));
	memset(wpslong, 0, MAX_NB_WP*sizeof(double));
	memset(wpsalt, 0, MAX_NB_WP*sizeof(double));

	DeleteCriticalSection(&strtimeCS);

	DeleteCriticalSection(&RegistersCS);

	DeleteCriticalSection(&idsCS);

	DeleteCriticalSection(&OpenCVVideoRecordCS);
	DeleteCriticalSection(&OpenCVVideoCS);
	DeleteCriticalSection(&OpenCVGUICS);

	DeleteCriticalSection(&MissionFilesCS);

	DeleteCriticalSection(&StateVariablesCS);

#ifndef DISABLE_OPENCV_SUPPORT
	cvReleaseImage(&SeanetOverlayImg);
#endif // !DISABLE_OPENCV_SUPPORT
	DeleteCriticalSection(&SeanetDataCS);
	DeleteCriticalSection(&SeanetConnectingCS);
	DeleteCriticalSection(&SeanetOverlayImgCS);

	DeleteCriticalSection(&MDMCS);

	DeleteCriticalSection(&FollowMeCS);

	for (i = MAX_NB_EXTERNALPROGRAMTRIGGER-1; i >= 0; i--)
	{
		DeleteCriticalSection(&ExternalProgramTriggerCS[i]);
	}

#ifndef DISABLE_OPENCV_SUPPORT
	cvReleaseImage(&PingerOverlayImg);
	DeleteCriticalSection(&PingerOverlayImgCS);
	DeleteCriticalSection(&PingerCS);

	cvReleaseImage(&ObstacleOverlayImg);
	DeleteCriticalSection(&ObstacleOverlayImgCS);
	DeleteCriticalSection(&ObstacleCS);

	cvReleaseImage(&SurfaceVisualObstacleOverlayImg);
	DeleteCriticalSection(&SurfaceVisualObstacleOverlayImgCS);
	DeleteCriticalSection(&SurfaceVisualObstacleCS);
		
	for (i = MAX_NB_BALL-1; i >= 0; i--)
	{
		cvReleaseImage(&BallOverlayImg[i]);
		DeleteCriticalSection(&BallOverlayImgCS[i]);
		DeleteCriticalSection(&BallCS[i]);
	}

	cvReleaseImage(&WallOverlayImg);
	DeleteCriticalSection(&WallOverlayImgCS);
	DeleteCriticalSection(&WallCS);

	cvReleaseImage(&ExternalVisualLocalizationOverlayImg);
	DeleteCriticalSection(&ExternalVisualLocalizationOverlayImgCS);
	DeleteCriticalSection(&ExternalVisualLocalizationCS);
#endif // !DISABLE_OPENCV_SUPPORT

	DeleteCriticalSection(&SonarAltitudeEstimationCS);

	for (i = nbopencvgui-1; i >= 0; i--)
	{
#ifndef DISABLE_OPENCV_SUPPORT
		cvReleaseImage(&dispimgs[i]);
#endif // !DISABLE_OPENCV_SUPPORT
		DeleteCriticalSection(&dispimgsCS[i]);
	}

	for (i = MAX_NB_VIDEO-1; i >= 0; i--)
	{
		videorecordheight[i] = videoimgheight;
		videorecordwidth[i] = videoimgwidth;
		memset(endvideorecordfilenames[i], 0, sizeof(endvideorecordfilenames[i]));
		endvideorecordfiles[i] = NULL;
		memset(videorecordfilenames[i], 0, sizeof(videorecordfilenames[i]));
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		videorecordfiles[i] = NULL;
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#endif // !DISABLE_OPENCV_SUPPORT
		bVideoRecordRestart[i] = FALSE;
		VideoRecordRequests[i] = 0;
		DeleteCriticalSection(&VideoRecordRequestsCS[i]);
		bRestartVideo[i] = FALSE;
		bPauseVideo[i] = FALSE;
		xVideo[i] = 0; yVideo[i] = 0; zVideo[i] = 0; phiVideo[i] = 0; thetaVideo[i] = 0; psiVideo[i] = 0;
		VerticalBeamVideo[i]  = 50;
		HorizontalBeamVideo[i] = 70;
#ifndef DISABLE_OPENCV_SUPPORT
		if (!bUseRawImgPtrVideo) cvReleaseImage(&imgs[i]); else cvReleaseImage(&imgsbak[i]); // imgsbak has been kept in case imgs was overwritten...
#endif // !DISABLE_OPENCV_SUPPORT
		DeleteCriticalSection(&imgsCS[i]);
	}

	for (i = MAX_NB_POLOLU-1; i >= 0; i--)
	{
		bRestartPololu[i] = FALSE;
		bPausePololu[i] = FALSE;
		SetPositionMaestroPololu[i] = -1;
		ShowGetPositionMaestroPololu[i] = -1;
	}

	for (i = MAX_NB_ROBOTEQ-1; i >= 0; i--)
	{
		bRestartRoboteq[i] = FALSE;
		bPauseRoboteq[i] = FALSE;
	}

	for (i = MAX_NB_MAVLINKDEVICE-1; i >= 0; i--)
	{
		bRestartMAVLinkDevice[i] = FALSE;
		bPauseMAVLinkDevice[i] = FALSE;
		GNSSqualityMAVLinkDevice[i] = 0;
		land_altitudeMAVLinkDevice[i] = 0;
		land_longitudeMAVLinkDevice[i] = 0;
		land_latitudeMAVLinkDevice[i] = 0;
		land_yawMAVLinkDevice[i] = 0;
		bLandMAVLinkDevice[i] = FALSE;
		takeoff_altitudeMAVLinkDevice[i] = 0;
		bTakeoffMAVLinkDevice[i] = FALSE;
		setattitudetargetthrustMAVLinkDevice[i] = 0;
		setattitudetargetyaw_rateMAVLinkDevice[i] = 0;
		setattitudetargetpitch_rateMAVLinkDevice[i] = 0;
		setattitudetargetroll_rateMAVLinkDevice[i] = 0;
		setattitudetargetyawMAVLinkDevice[i] = 0;
		setattitudetargetpitchMAVLinkDevice[i] = 0;
		setattitudetargetrollMAVLinkDevice[i] = 0;
		setattitudetargettypeMAVLinkDevice[i] = -1;
		setattitudetargetperiodMAVLinkDevice[i] = -1;
		iArmMAVLinkDevice[i] = -1;
		custom_modeMAVLinkDevice[i] = -1;
		bDisplayStatusTextMAVLinkDevice[i] = FALSE;
		bEnableMAVLinkDeviceIN[i] = FALSE;
	}

	for (i = MAX_NB_UBLOX-1; i >= 0; i--)
	{
		RTCMuserslist.pop_back();
		bRestartublox[i] = FALSE;
		bPauseublox[i] = FALSE;
		GNSSqualityublox[i] = 0;
	}

	for (i = MAX_NB_NMEADEVICE-1; i >= 0; i--)
	{
		bRestartNMEADevice[i] = FALSE;
		bPauseNMEADevice[i] = FALSE;
		GNSSqualityNMEADevice[i] = 0;
	}

	for (i = MAX_NB_BLUEVIEW-1; i >= 0; i--)
	{
		bRestartBlueView[i] = FALSE;
		bPauseBlueView[i] = FALSE;
	}

	return EXIT_SUCCESS;
}